

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  *pFVar3;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar4;
  Fad<double> *pFVar5;
  double *pdVar6;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar7;
  double *pdVar8;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar9;
  double *pdVar10;
  double *pdVar11;
  ulong uVar12;
  value_type vVar13;
  
  pFVar3 = (fadexpr->fadexpr_).left_;
  uVar1 = (((((pFVar3->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts;
  uVar2 = (((((pFVar3->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar1 = (((((fadexpr->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar2 <= (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar1 = (this->dx_).num_elts;
  if (uVar2 != uVar1) {
    if (uVar2 == 0) {
      if (uVar1 != 0) {
        pdVar11 = (this->dx_).ptr_to_data;
        if (pdVar11 != (double *)0x0) {
          operator_delete__(pdVar11);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar1 != 0) {
        pdVar11 = (this->dx_).ptr_to_data;
        if (pdVar11 != (double *)0x0) {
          operator_delete__(pdVar11);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar2;
      uVar12 = 0xffffffffffffffff;
      if (-1 < (int)uVar2) {
        uVar12 = (long)(int)uVar2 << 3;
      }
      pdVar11 = (double *)operator_new__(uVar12);
      (this->dx_).ptr_to_data = pdVar11;
    }
  }
  if (uVar2 != 0) {
    pdVar11 = (this->dx_).ptr_to_data;
    pFVar3 = (fadexpr->fadexpr_).left_;
    pFVar4 = (pFVar3->fadexpr_).left_;
    pFVar5 = (pFVar4->fadexpr_).right_;
    if ((((pFVar5->dx_).num_elts == 0) ||
        ((((((pFVar3->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts == 0)) ||
       ((((((fadexpr->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts == 0)) {
      if (0 < (int)uVar2) {
        uVar12 = 0;
        do {
          vVar13 = FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>
                   ::dx(&fadexpr->fadexpr_,(int)uVar12);
          pdVar11[uVar12] = vVar13;
          uVar12 = uVar12 + 1;
        } while (uVar2 != uVar12);
      }
    }
    else if (0 < (int)uVar2) {
      pdVar6 = (pFVar5->dx_).ptr_to_data;
      pFVar7 = (pFVar3->fadexpr_).right_;
      pdVar8 = (((pFVar7->fadexpr_).right_)->dx_).ptr_to_data;
      pFVar9 = (fadexpr->fadexpr_).right_;
      pdVar10 = (((pFVar9->fadexpr_).right_)->dx_).ptr_to_data;
      uVar12 = 0;
      do {
        pdVar11[uVar12] =
             pdVar10[uVar12] * (pFVar9->fadexpr_).left_.constant_ +
             pdVar8[uVar12] * (pFVar7->fadexpr_).left_.constant_ +
             pdVar6[uVar12] * (pFVar4->fadexpr_).left_.constant_;
        uVar12 = uVar12 + 1;
      } while (uVar2 != uVar12);
    }
  }
  pFVar3 = (fadexpr->fadexpr_).left_;
  pFVar4 = (fadexpr->fadexpr_).right_;
  pFVar7 = (pFVar3->fadexpr_).left_;
  pFVar9 = (pFVar3->fadexpr_).right_;
  this->val_ = (pFVar4->fadexpr_).left_.constant_ * ((pFVar4->fadexpr_).right_)->val_ +
               (pFVar9->fadexpr_).left_.constant_ * ((pFVar9->fadexpr_).right_)->val_ +
               (pFVar7->fadexpr_).left_.constant_ * ((pFVar7->fadexpr_).right_)->val_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}